

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdEncryptAES(void *handle,char *key,char *cbc_iv,char *buffer,char **output)

{
  char *pcVar1;
  CfdException *pCVar2;
  undefined1 local_b0 [32];
  ByteData iv;
  ByteData key_data;
  ByteData data;
  ByteData aes_data;
  
  cfd::Initialize();
  if (key == (char *)0x0) {
    local_b0._0_8_ = "cfdcapi_common.cpp";
    local_b0._8_4_ = 0x2d3;
    local_b0._16_8_ = "CfdEncryptAES";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_b0,"key is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_b0,"Failed to parameter. key is null.",(allocator *)&key_data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (buffer != (char *)0x0) {
    if (output != (char **)0x0) {
      std::__cxx11::string::string((string *)local_b0,key,(allocator *)&data);
      cfd::core::ByteData::ByteData(&key_data,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::string((string *)local_b0,buffer,(allocator *)&iv);
      cfd::core::ByteData::ByteData(&data,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      if ((cbc_iv == (char *)0x0) || (*cbc_iv == '\0')) {
        cfd::core::CryptoUtil::EncryptAes256(&iv,&key_data,&data);
        cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_b0,&iv);
        pcVar1 = cfd::capi::CreateString((string *)local_b0);
        *output = pcVar1;
        std::__cxx11::string::~string((string *)local_b0);
      }
      else {
        std::__cxx11::string::string((string *)local_b0,cbc_iv,(allocator *)&aes_data);
        cfd::core::ByteData::ByteData(&iv,(string *)local_b0);
        std::__cxx11::string::~string((string *)local_b0);
        cfd::core::CryptoUtil::EncryptAes256Cbc(&aes_data,&key_data,&iv,&data);
        cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_b0,&aes_data);
        pcVar1 = cfd::capi::CreateString((string *)local_b0);
        *output = pcVar1;
        std::__cxx11::string::~string((string *)local_b0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&aes_data);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&iv);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key_data);
      return 0;
    }
    local_b0._0_8_ = "cfdcapi_common.cpp";
    local_b0._8_4_ = 0x2df;
    local_b0._16_8_ = "CfdEncryptAES";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_b0,"output is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_b0,"Failed to parameter. output is null.",(allocator *)&key_data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b0);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_b0._0_8_ = "cfdcapi_common.cpp";
  local_b0._8_4_ = 0x2d9;
  local_b0._16_8_ = "CfdEncryptAES";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_b0,"buffer is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_b0,"Failed to parameter. buffer is null.",(allocator *)&key_data);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_b0);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdEncryptAES(
    void* handle, const char* key, const char* cbc_iv, const char* buffer,
    char** output) {
  try {
    cfd::Initialize();
    if (key == nullptr) {
      warn(CFD_LOG_SOURCE, "key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null.");
    }
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    ByteData key_data(key);
    ByteData data(buffer);

    if (cfd::capi::IsEmptyString(cbc_iv)) {
      auto aes_data = cfd::core::CryptoUtil::EncryptAes256(key_data, data);
      *output = cfd::capi::CreateString(aes_data.GetHex());
    } else {
      ByteData iv(cbc_iv);
      auto aes_data =
          cfd::core::CryptoUtil::EncryptAes256Cbc(key_data, iv, data);
      *output = cfd::capi::CreateString(aes_data.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}